

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

int32_t __thiscall
icu_63::RuleBasedCollator::internalNextSortKeyPart
          (RuleBasedCollator *this,UCharIterator *iter,uint32_t *state,uint8_t *dest,int32_t count,
          UErrorCode *errorCode)

{
  byte bVar1;
  CollationSettings *settings;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  UChar *s;
  Level minLevel;
  SortKeyByteSink local_260;
  RuleBasedCollator *local_240;
  PartLevelCallback callback;
  UIterCollationIterator ci;
  
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if ((count < 0 || (state == (uint32_t *)0x0 || iter == (UCharIterator *)0x0)) ||
     (dest == (uint8_t *)0x0 && count != 0)) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if (count == 0) {
    return 0;
  }
  local_260.appended_ = 0;
  local_260.super_ByteSink._vptr_ByteSink = (_func_int **)&PTR__SortKeyByteSink_00472348;
  local_260.ignore_ = state[1];
  local_260.buffer_ = (char *)dest;
  local_260.capacity_ = count;
  local_240 = this;
  (*iter->move)(iter,0,UITER_START);
  minLevel = *state;
  if ((int)minLevel < 6) {
    settings = local_240->settings;
    bVar1 = (byte)settings->options;
    ci.super_CollationIterator.isNumeric = bVar1 >> 1 & 1;
    callback.super_LevelCallback._vptr_LevelCallback = (_func_int **)&PTR__LevelCallback_004723a8;
    callback.sink = &local_260;
    callback.level = PRIMARY_LEVEL;
    callback.levelCapacity = (local_260.capacity_ + local_260.ignore_) - local_260.appended_;
    ci.iter = iter;
    if ((bVar1 & 1) == 0) {
      ci.super_CollationIterator.data = local_240->data;
      ci.super_CollationIterator.trie = (ci.super_CollationIterator.data)->trie;
      ci.super_CollationIterator.ceBuffer.buffer.ptr =
           ci.super_CollationIterator.ceBuffer.buffer.stackArray;
      ci.super_CollationIterator.ceBuffer.length = 0;
      ci.super_CollationIterator.ceBuffer.buffer.capacity = 0x28;
      ci.super_CollationIterator.ceBuffer.buffer.needToRelease = '\0';
      ci.super_CollationIterator.cesIndex = 0;
      ci.super_CollationIterator.skipped = (SkippedState *)0x0;
      ci.super_CollationIterator.numCpFwd = -1;
      ci.super_CollationIterator.super_UObject._vptr_UObject =
           (_func_int **)&PTR__UIterCollationIterator_00472a88;
      CollationKeys::writeSortKeyUpToQuaternary
                (&ci.super_CollationIterator,(ci.super_CollationIterator.data)->compressibleBytes,
                 settings,&local_260,minLevel,&callback.super_LevelCallback,'\0',errorCode);
      UIterCollationIterator::~UIterCollationIterator(&ci);
    }
    else {
      ci.super_CollationIterator.data = local_240->data;
      ci.super_CollationIterator.trie = (ci.super_CollationIterator.data)->trie;
      ci.super_CollationIterator.ceBuffer.buffer.ptr =
           ci.super_CollationIterator.ceBuffer.buffer.stackArray;
      ci.super_CollationIterator.ceBuffer.length = 0;
      ci.super_CollationIterator.ceBuffer.buffer.capacity = 0x28;
      ci.super_CollationIterator.ceBuffer.buffer.needToRelease = '\0';
      ci.super_CollationIterator.cesIndex = 0;
      ci.super_CollationIterator.skipped = (SkippedState *)0x0;
      ci.super_CollationIterator.numCpFwd = -1;
      ci.super_CollationIterator.super_UObject._vptr_UObject =
           (_func_int **)&PTR__FCDUIterCollationIterator_004729f8;
      CollationKeys::writeSortKeyUpToQuaternary
                (&ci.super_CollationIterator,(ci.super_CollationIterator.data)->compressibleBytes,
                 settings,&local_260,minLevel,&callback.super_LevelCallback,'\0',errorCode);
      FCDUIterCollationIterator::~FCDUIterCollationIterator((FCDUIterCollationIterator *)&ci);
    }
    uVar4 = 0;
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if (local_260.appended_ <= count) {
        if ((local_240->settings->options & 0xfffff000U) == 0xf000) {
          minLevel = IDENTICAL_LEVEL;
          (*iter->move)(iter,0,UITER_START);
        }
        CollationKeys::LevelCallback::~LevelCallback(&callback.super_LevelCallback);
        goto LAB_00243e6f;
      }
      *(ulong *)state = CONCAT44(callback.levelCapacity,callback.level);
      uVar4 = count;
    }
    CollationKeys::LevelCallback::~LevelCallback(&callback.super_LevelCallback);
    goto LAB_00243f7c;
  }
LAB_00243e6f:
  if (minLevel == IDENTICAL_LEVEL) {
    uVar2 = (local_260.capacity_ + local_260.ignore_) - local_260.appended_;
    ci.super_CollationIterator.super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_00487e70;
    ci.super_CollationIterator.trie = (UTrie2 *)CONCAT62(ci.super_CollationIterator.trie._2_6_,2);
    while (iVar3 = (*(code *)iter->next)(iter), -1 < iVar3) {
      callback.super_LevelCallback._vptr_LevelCallback._0_2_ = (short)iVar3;
      icu_63::UnicodeString::doAppend((UnicodeString *)&ci,(UChar *)&callback,0,1);
    }
    if (((ulong)ci.super_CollationIterator.trie & 0x11) == 0) {
      if (((ulong)ci.super_CollationIterator.trie & 2) == 0) {
        s = (UChar *)CONCAT44(ci.super_CollationIterator.ceBuffer._4_4_,
                              ci.super_CollationIterator.ceBuffer.length);
      }
      else {
        s = (UChar *)((long)&ci.super_CollationIterator.trie + 2);
      }
    }
    else {
      s = (UChar *)0x0;
    }
    if ((short)ci.super_CollationIterator.trie < 0) {
      iVar3 = ci.super_CollationIterator.trie._4_4_;
    }
    else {
      iVar3 = (int)(short)ci.super_CollationIterator.trie >> 5;
    }
    writeIdenticalLevel(local_240,s,s + iVar3,&local_260,errorCode);
    uVar4 = 0;
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if (local_260.appended_ <= count) {
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)&ci);
        goto LAB_00243f52;
      }
      *state = 6;
      state[1] = uVar2;
      uVar4 = count;
    }
    icu_63::UnicodeString::~UnicodeString((UnicodeString *)&ci);
  }
  else {
LAB_00243f52:
    uVar4 = local_260.appended_;
    state[0] = 7;
    state[1] = 0;
    if (local_260.appended_ < count) {
      memset(dest + local_260.appended_,0,(ulong)(uint)(~local_260.appended_ + count) + 1);
    }
  }
LAB_00243f7c:
  SortKeyByteSink::~SortKeyByteSink(&local_260);
  return uVar4;
}

Assistant:

int32_t
RuleBasedCollator::internalNextSortKeyPart(UCharIterator *iter, uint32_t state[2],
                                           uint8_t *dest, int32_t count, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    if(iter == NULL || state == NULL || count < 0 || (count > 0 && dest == NULL)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(count == 0) { return 0; }

    FixedSortKeyByteSink sink(reinterpret_cast<char *>(dest), count);
    sink.IgnoreBytes((int32_t)state[1]);
    iter->move(iter, 0, UITER_START);

    Collation::Level level = (Collation::Level)state[0];
    if(level <= Collation::QUATERNARY_LEVEL) {
        UBool numeric = settings->isNumeric();
        PartLevelCallback callback(sink);
        if(settings->dontCheckFCD()) {
            UIterCollationIterator ci(data, numeric, *iter);
            CollationKeys::writeSortKeyUpToQuaternary(ci, data->compressibleBytes, *settings,
                                                      sink, level, callback, FALSE, errorCode);
        } else {
            FCDUIterCollationIterator ci(data, numeric, *iter, 0);
            CollationKeys::writeSortKeyUpToQuaternary(ci, data->compressibleBytes, *settings,
                                                      sink, level, callback, FALSE, errorCode);
        }
        if(U_FAILURE(errorCode)) { return 0; }
        if(sink.NumberOfBytesAppended() > count) {
            state[0] = (uint32_t)callback.getLevel();
            state[1] = (uint32_t)callback.getLevelCapacity();
            return count;
        }
        // All of the normal levels are done.
        if(settings->getStrength() == UCOL_IDENTICAL) {
            level = Collation::IDENTICAL_LEVEL;
            iter->move(iter, 0, UITER_START);
        }
        // else fall through to setting ZERO_LEVEL
    }

    if(level == Collation::IDENTICAL_LEVEL) {
        int32_t levelCapacity = sink.GetRemainingCapacity();
        UnicodeString s;
        for(;;) {
            UChar32 c = iter->next(iter);
            if(c < 0) { break; }
            s.append((UChar)c);
        }
        const UChar *sArray = s.getBuffer();
        writeIdenticalLevel(sArray, sArray + s.length(), sink, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        if(sink.NumberOfBytesAppended() > count) {
            state[0] = (uint32_t)level;
            state[1] = (uint32_t)levelCapacity;
            return count;
        }
    }

    // ZERO_LEVEL: Fill the remainder of dest with 00 bytes.
    state[0] = (uint32_t)Collation::ZERO_LEVEL;
    state[1] = 0;
    int32_t length = sink.NumberOfBytesAppended();
    int32_t i = length;
    while(i < count) { dest[i++] = 0; }
    return length;
}